

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_str_insert_text_runes(nk_str *str,int pos,nk_rune *runes,int len)

{
  int len_00;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  nk_glyph glyph;
  
  iVar1 = 0;
  if (len != 0 && (runes != (nk_rune *)0x0 && str != (nk_str *)0x0)) {
    uVar3 = 0;
    uVar2 = 0;
    if (0 < len) {
      uVar2 = (ulong)(uint)len;
    }
    while ((iVar1 = len, uVar2 != uVar3 &&
           (len_00 = nk_utf_encode(runes[uVar3],glyph,4), len_00 != 0))) {
      nk_str_insert_at_rune(str,pos + (int)uVar3,glyph,len_00);
      uVar3 = uVar3 + 1;
    }
  }
  return iVar1;
}

Assistant:

NK_API int
nk_str_insert_text_runes(struct nk_str *str, int pos, const nk_rune *runes, int len)
{
    int i = 0;
    int byte_len = 0;
    nk_glyph glyph;

    NK_ASSERT(str);
    if (!str || !runes || !len) return 0;
    for (i = 0; i < len; ++i) {
        byte_len = nk_utf_encode(runes[i], glyph, NK_UTF_SIZE);
        if (!byte_len) break;
        nk_str_insert_at_rune(str, pos+i, glyph, byte_len);
    }
    return len;
}